

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

_Bool append_brand(_Bool **current,wchar_t pick)

{
  byte bVar1;
  brand_conflict *pbVar2;
  int iVar3;
  _Bool *p_Var4;
  ulong uVar5;
  char **ppcVar6;
  
  pbVar2 = brands;
  p_Var4 = *current;
  bVar1 = z_info->brand_max;
  if (p_Var4 == (_Bool *)0x0) {
    p_Var4 = (_Bool *)mem_zalloc((ulong)bVar1);
    *current = p_Var4;
  }
  else if (1 < bVar1) {
    ppcVar6 = &brands[1].name;
    uVar5 = 1;
    do {
      if ((p_Var4[uVar5] == true) && (iVar3 = strcmp(*ppcVar6,pbVar2[pick].name), iVar3 == 0)) {
        if (pbVar2[pick].multiplier <= *(int *)(ppcVar6 + 3)) {
          return false;
        }
        p_Var4[uVar5] = false;
        break;
      }
      uVar5 = uVar5 + 1;
      ppcVar6 = ppcVar6 + 6;
    } while (bVar1 != uVar5);
  }
  p_Var4[pick] = true;
  return true;
}

Assistant:

bool append_brand(bool **current, int pick)
{
	int i;
	struct brand *brand = &brands[pick];

	/* No existing brands means OK to add */
	if (!(*current)) {
		*current = mem_zalloc(z_info->brand_max * sizeof(bool));
		(*current)[pick] = true;
		return true;
	}

	/* Check the existing brands for name matches */
	for (i = 1; i < z_info->brand_max; i++) {
		if ((*current)[i]) {
			/* If we get the same element, check the multiplier */
			if (streq(brands[i].name, brand->name)) {
				/* Same multiplier or smaller, fail */
				if (brand->multiplier <= brands[i].multiplier)
					return false;

				/* Greater multiplier, replace and accept */
				(*current)[i] = false;
				(*current)[pick] = true;
				return true;
			}
		}
	}

	/* We can add the new one now */
	(*current)[pick] = true;

	return true;
}